

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O1

int __thiscall ON_String::Replace(ON_String *this,char utf8_single_byte_c1,char utf8_single_byte_c2)

{
  int iVar1;
  ON_Internal_Empty_aString *pOVar2;
  long lVar3;
  int iVar4;
  
  iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c1);
  iVar4 = 0;
  if (iVar1 != 0) {
    iVar1 = ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c2);
    iVar4 = 0;
    if (iVar1 != 0) {
      pOVar2 = &empty_astring;
      if (this->m_s != (char *)0x0) {
        pOVar2 = (ON_Internal_Empty_aString *)(this->m_s + -0xc);
      }
      lVar3 = (long)(pOVar2->header).string_length;
      if (lVar3 != 0) {
        iVar4 = 0;
        do {
          if (this->m_s[lVar3 + -1] == utf8_single_byte_c1) {
            if (iVar4 == 0) {
              CopyArray(this);
            }
            this->m_s[lVar3 + -1] = utf8_single_byte_c2;
            iVar4 = iVar4 + 1;
          }
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
    }
  }
  return iVar4;
}

Assistant:

int ON_String::Replace(char utf8_single_byte_c1, char utf8_single_byte_c2)
{
  int count = 0;
  if (ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c1) && ON_IsValidSingleByteUTF8CharValue(utf8_single_byte_c2))
  {
    int i = Length();
    while (i--)
    {
      if (utf8_single_byte_c1 == m_s[i])
      {
        if (0 == count)
          CopyArray();
        m_s[i] = utf8_single_byte_c2;
        count++;
      }
    }
  }
  return count;
}